

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O1

void __thiscall irr::gui::CGUITabControl::removeChild(CGUITabControl *this,IGUIElement *child)

{
  int idx;
  
  idx = (**(code **)(*(long *)this + 0x160))();
  if (-1 < idx) {
    removeTabButNotChild(this,idx);
  }
  IGUIElement::removeChild((IGUIElement *)this,child);
  recalculateScrollBar(this);
  return;
}

Assistant:

void CGUITabControl::removeChild(IGUIElement *child)
{
	s32 idx = getTabIndex(child);
	if (idx >= 0)
		removeTabButNotChild(idx);

	// remove real element
	IGUIElement::removeChild(child);

	recalculateScrollBar();
}